

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O2

void __thiscall MxxReduce_ReduceOne_Test::TestBody(MxxReduce_ReduceOne_Test *this)

{
  int iVar1;
  char *pcVar2;
  datatype dt;
  comm local_c8;
  AssertionResult gtest_ar;
  MPI_Datatype local_78;
  MPI_Op local_70;
  float m;
  int u;
  int v;
  int g;
  int z;
  int y;
  comm c;
  int x;
  
  mxx::comm::comm(&c);
  x = (c.m_size - c.m_rank) * -0xd;
  y = mxx::reduce<int,mxx::min<int>>(&x,(long)c.m_size / 2 & 0xffffffff,&c);
  if (c.m_rank == c.m_size / 2) {
    dt._vptr_datatype = (_func_int **)CONCAT44(dt._vptr_datatype._4_4_,c.m_size * -0xd);
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"-13*c.size()","y",(int *)&dt,&y);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&dt);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                 ,0x7e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&dt);
    }
    else {
LAB_0011d9ec:
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      gtest_ar._0_4_ = 3;
      z = mxx::reduce<int,std::plus<int>>(&gtest_ar,0,&c);
      if (c.m_rank == 0) {
        dt._vptr_datatype = (_func_int **)CONCAT44(dt._vptr_datatype._4_4_,c.m_size * 3);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&gtest_ar,"3*c.size()","z",(int *)&dt,&z);
        if (gtest_ar.success_ != false) goto LAB_0011daca;
        testing::Message::Message((Message *)&dt);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_c8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                   ,0x85,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&dt);
      }
      else {
        dt._vptr_datatype = (_func_int **)((ulong)dt._vptr_datatype._4_4_ << 0x20);
        testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"0","z",(int *)&dt,&z);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&dt);
          if (gtest_ar.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_c8,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                     ,0x87,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&dt);
        }
        else {
LAB_0011daca:
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          iVar1 = c.m_size;
          v = 2;
          mxx::comm::comm(&local_c8);
          gtest_ar._0_8_ = &PTR__custom_op_00172498;
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          dt.builtin = false;
          dt._17_7_ = 0;
          dt._vptr_datatype = (_func_int **)0x0;
          dt.mpitype = (MPI_Datatype)0x0;
          gtest_ar.message_.ptr_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x10);
          ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p =
               (pointer)mxx::custom_op<int>::
                        custom_function<MxxReduce_ReduceOne_Test::TestBody()::__0>;
          dt._vptr_datatype = (_func_int **)0x0;
          dt.mpitype = (MPI_Datatype)0x0;
          dt.builtin = false;
          dt._17_7_ = 0;
          std::_Function_base::~_Function_base((_Function_base *)&dt);
          dt._vptr_datatype = (_func_int **)&PTR__datatype_00171c90;
          dt.mpitype = (MPI_Datatype)&ompi_mpi_int;
          dt.builtin = true;
          MPI_Type_dup(&ompi_mpi_int,&local_78);
          m = 1.88755e-42;
          mxx::attr_map<int,_std::function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)>_>::set
                    (&local_78,(int *)&m,
                     (function<void_(void_*,_void_*,_int_*,_ompi_datatype_t_**)> *)
                     &gtest_ar.message_);
          MPI_Op_create(mxx::custom_op<int>::mpi_user_function,1,&local_70);
          mxx::datatype::~datatype(&dt);
          dt._vptr_datatype = (_func_int **)((ulong)dt._vptr_datatype & 0xffffffff00000000);
          MPI_Reduce(&v,&dt,1,local_78,local_70,iVar1 + -1,local_c8.mpi_comm);
          iVar1 = (int)dt._vptr_datatype;
          mxx::custom_op<int>::~custom_op((custom_op<int> *)&gtest_ar);
          mxx::comm::~comm(&local_c8);
          g = iVar1;
          if (c.m_rank == c.m_size + -1) {
            dt._vptr_datatype = (_func_int **)CONCAT44(dt._vptr_datatype._4_4_,c.m_size * 2);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"2*c.size()","g",(int *)&dt,&g);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&dt);
              if (gtest_ar.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_c8,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                         ,0x8c,pcVar2);
              testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&dt);
            }
            else {
LAB_0011dcc8:
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr(&gtest_ar.message_);
              gtest_ar._0_4_ = (float)c.m_rank * 1.3333;
              m = mxx::reduce<float,mymax<float>>(&gtest_ar,0);
              if (c.m_rank == 0) {
                dt._vptr_datatype =
                     (_func_int **)CONCAT44(dt._vptr_datatype._4_4_,(float)(c.m_size + -1) * 1.3333)
                ;
                testing::internal::CmpHelperEQ<float,float>
                          ((internal *)&gtest_ar,"1.3333f*(c.size()-1)","m",(float *)&dt,&m);
                if (gtest_ar.success_ != false) goto LAB_0011de84;
                testing::Message::Message((Message *)&dt);
                if (gtest_ar.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_c8,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                           ,0x93,pcVar2);
                testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&dt)
                ;
              }
              else {
                dt._vptr_datatype = (_func_int **)((ulong)dt._vptr_datatype._4_4_ << 0x20);
                testing::internal::CmpHelperEQ<int,float>
                          ((internal *)&gtest_ar,"0","m",(int *)&dt,&m);
                if (gtest_ar.success_ == false) {
                  testing::Message::Message((Message *)&dt);
                  if (gtest_ar.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&local_c8,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                             ,0x95,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&local_c8,(Message *)&dt);
                }
                else {
LAB_0011de84:
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr(&gtest_ar.message_);
                  v = c.m_rank + 1;
                  u = mxx::reduce<int,int(*)(int,int)>(&v,0,mymin,&c);
                  if (c.m_rank == 0) {
                    dt._vptr_datatype = (_func_int **)CONCAT44(dt._vptr_datatype._4_4_,1);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&gtest_ar,"1","u",(int *)&dt,&u);
                    if (gtest_ar.success_ != false) goto LAB_0011e10d;
                    testing::Message::Message((Message *)&dt);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_c8,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                               ,0x9b,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_c8,(Message *)&dt);
                  }
                  else {
                    dt._vptr_datatype = (_func_int **)((ulong)dt._vptr_datatype._4_4_ << 0x20);
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&gtest_ar,"0","u",(int *)&dt,&u);
                    if (gtest_ar.success_ != false) goto LAB_0011e10d;
                    testing::Message::Message((Message *)&dt);
                    if (gtest_ar.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&local_c8,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                               ,0x9d,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&local_c8,(Message *)&dt);
                  }
                }
              }
            }
          }
          else {
            dt._vptr_datatype = (_func_int **)((ulong)dt._vptr_datatype._4_4_ << 0x20);
            testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"0","g",(int *)&dt,&g);
            if (gtest_ar.success_ != false) goto LAB_0011dcc8;
            testing::Message::Message((Message *)&dt);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_c8,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
                       ,0x8e,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&dt);
          }
        }
      }
    }
  }
  else {
    dt._vptr_datatype = (_func_int **)((ulong)dt._vptr_datatype._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"0","y",(int *)&dt,&y);
    if (gtest_ar.success_ != false) goto LAB_0011d9ec;
    testing::Message::Message((Message *)&dt);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/test/test_reductions.cpp"
               ,0x80,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)&dt);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&dt);
LAB_0011e10d:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(MxxReduce, ReduceOne) {
    mxx::comm c = mxx::comm();

    // test min
    int x = -13*(c.size() - c.rank());
    int y = mxx::reduce(x, c.size()/2, mxx::min<int>(), c);
    if (c.rank() == c.size()/2) {
        ASSERT_EQ(-13*c.size(), y);
    } else {
        ASSERT_EQ(0, y);
    }
    // test sum
    int z = mxx::reduce(3, 0, std::plus<int>(), c);
    if (c.rank() == 0) {
        ASSERT_EQ(3*c.size(), z);
    } else {
        ASSERT_EQ(0, z);
    }
    // test lambda op
    int g = mxx::reduce(2, c.size()-1, [](int i, int j){return i+j;});
    if (c.rank() == c.size()-1) {
        ASSERT_EQ(2*c.size(), g);
    } else {
        ASSERT_EQ(0, g);
    }
    // test functor
    float m = mxx::reduce(1.3333f*c.rank(), 0, mymax<float>(), c);
    if (c.rank() == 0) {
        ASSERT_EQ(1.3333f*(c.size()-1), m);
    } else {
        ASSERT_EQ(0, m);
    }
    // test own function pointer
    int v = c.rank() + 1;
    int u = mxx::reduce(v, 0, mymin, c);
    if (c.rank() == 0) {
        ASSERT_EQ(1, u);
    } else {
        ASSERT_EQ(0, u);
    }
}